

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_FMUL_zzx(DisasContext_conflict1 *s,arg_FMUL_zzx *a)

{
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_ptr ptr;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = s->sve_len;
    ptr = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
    tcg_gen_gvec_3_ptr_aarch64
              (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->rm * 0x100 + 0xc10,ptr,oprsz,
               oprsz,a->index,*(undefined1 **)(&DAT_010640a8 + (long)a->esz * 8));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_FMUL_zzx(DisasContext *s, arg_FMUL_zzx *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3_ptr * const fns[3] = {
        gen_helper_gvec_fmul_idx_h,
        gen_helper_gvec_fmul_idx_s,
        gen_helper_gvec_fmul_idx_d,
    };

    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           status, vsz, vsz, a->index, fns[a->esz - 1]);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}